

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedCopyImage::Run(AdvancedCopyImage *this)

{
  bool bVar1;
  GLint GVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  CallLogWrapper *this_00;
  Vector<float,_4> local_9c;
  Vector<float,_4> local_8c;
  int local_7c;
  int local_78;
  int w;
  int h;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> rdata;
  allocator<tcu::Vector<float,_4>_> local_41;
  Vector<float,_4> local_40;
  undefined1 local_30 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  AdvancedCopyImage_conflict *this_local;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  glu::CallLogWrapper::glUseProgram(this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat)
  ;
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat,"g_input_image"
                    );
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,0);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    (this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat,
                     "g_output_image");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,1);
  iVar3 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
  iVar4 = ShaderImageLoadStoreBase::getWindowHeight((ShaderImageLoadStoreBase *)this);
  tcu::Vector<float,_4>::Vector(&local_40,7.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_41);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30,
             (long)(iVar3 * iVar4),&local_40,&local_41);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_41);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0x2801,0x2601);
  iVar3 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
  iVar4 = ShaderImageLoadStoreBase::getWindowHeight((ShaderImageLoadStoreBase *)this);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_30,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0,0x8814,iVar3,iVar4,0,0x1908,0x1406,pvVar6);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,*(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0x2801,0x2601);
  iVar3 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
  iVar4 = ShaderImageLoadStoreBase::getWindowHeight((ShaderImageLoadStoreBase *)this);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0,0x8814,iVar3,iVar4,0,0x1908,0x1406,(void *)0x0);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget,0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,*(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4),0,'\0',0,0x88b9
             ,0x8814);
  glu::CallLogWrapper::glClear
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x4000);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,*(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
  glu::CallLogWrapper::glDrawElementsInstancedBaseInstance
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,5,4,0x1403,(void *)0x0,1,0);
  iVar3 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
  iVar4 = ShaderImageLoadStoreBase::getWindowHeight((ShaderImageLoadStoreBase *)this);
  std::allocator<tcu::Vector<float,_4>_>::allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&w + 3));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&h,
             (long)(iVar3 * iVar4),(allocator<tcu::Vector<float,_4>_> *)((long)&w + 3));
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&w + 3));
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,*(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&h,0
                     );
  glu::CallLogWrapper::glGetTexImage
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0xde1,0,0x1908,0x1406,pvVar6);
  local_78 = 0;
  do {
    iVar3 = local_78;
    iVar4 = ShaderImageLoadStoreBase::getWindowHeight((ShaderImageLoadStoreBase *)this);
    if (iVar4 <= iVar3) {
      this_local = (AdvancedCopyImage_conflict *)0x0;
LAB_010853bf:
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&h);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30)
      ;
      return (long)this_local;
    }
    local_7c = 0;
    while( true ) {
      iVar3 = local_7c;
      iVar5 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
      iVar4 = local_78;
      if (iVar5 <= iVar3) break;
      iVar3 = ShaderImageLoadStoreBase::getWindowWidth((ShaderImageLoadStoreBase *)this);
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &h,(long)(iVar4 * iVar3 + local_7c));
      tcu::Vector<float,_4>::Vector(&local_8c,pvVar6);
      tcu::Vector<float,_4>::Vector(&local_9c,7.0);
      bVar1 = ShaderImageLoadStoreBase::IsEqual
                        ((ShaderImageLoadStoreBase *)this,&local_8c,&local_9c);
      if (!bVar1) {
        this_local = (AdvancedCopyImage_conflict *)&DAT_ffffffffffffffff;
        goto LAB_010853bf;
      }
      local_7c = local_7c + 1;
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs = NL "#define TILE_WIDTH 16" NL "#define TILE_HEIGHT 16" NL
									   "const ivec2 kTileSize = ivec2(TILE_WIDTH, TILE_HEIGHT);" NL NL
									   "layout(binding = 0, rgba8) uniform image2D g_input_image;" NL
									   "layout(binding = 1, rgba8) uniform image2D g_output_image;" NL	NL
									   "layout(local_size_x=TILE_WIDTH, local_size_y=TILE_HEIGHT) in;" NL NL
									   "void main() {" NL "  const ivec2 tile_xy = ivec2(gl_WorkGroupID);" NL
									   "  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL
									   "  const ivec2 pixel_xy = tile_xy * kTileSize + thread_xy;" NL NL
									   "  vec4 pixel = imageLoad(g_input_image, pixel_xy);" NL
									   "  imageStore(g_output_image, pixel_xy, pixel);" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		std::vector<GLubyte> in_image(64 * 64 * 4, 0x0f);
		std::vector<GLubyte> out_image(64 * 64 * 4, 0x00);

		glGenTextures(2, m_texture);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, 64, 64, 0, GL_RGBA, GL_UNSIGNED_BYTE, &in_image[0]);

		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, 64, 64, 0, GL_RGBA, GL_UNSIGNED_BYTE, &out_image[0]);

		glUseProgram(m_program);
		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA8);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA8);
		glDispatchCompute(5, 4,
						  1); // 5 is on purpose, to ensure that out of bounds image load and stores have no effect
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

		std::vector<GLubyte> data(64 * 64 * 4);
		glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
		for (std::size_t i = 0; i < data.size(); ++i)
		{
			if (getWindowWidth() > 100 && data[i] != 0x0f)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], 0x0f);
				return ERROR;
			}
		}

		return NO_ERROR;
	}